

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert_eol_matcher.hpp
# Opt level: O0

bool __thiscall
boost::xpressive::detail::
assert_eol_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::
match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (assert_eol_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
           *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *state,
          matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *next)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  x;
  bool bVar1;
  byte bVar2;
  uint uVar3;
  reference pcVar4;
  cpp_regex_traits<char> *this_00;
  long *in_RDX;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  char_type ch;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  char local_21;
  long *local_20;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::eos(in_RDI);
  if (bVar1) {
    if (((ulong)local_18[5]._M_current & 0x1000000) == 0) {
      return false;
    }
  }
  else {
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(local_18);
    local_21 = *pcVar4;
    this_00 = &traits_cast<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                         ((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x15db91)->super_cpp_regex_traits<char>;
    uVar3 = cpp_regex_traits<char>::isctype
                      (this_00,(int)local_21,(uint)*(ushort *)&(in_RDI->cur_)._M_current);
    if ((uVar3 & 1) == 0) {
      return false;
    }
    uVar5 = false;
    if ((local_21 == *(char *)((long)&(in_RDI->cur_)._M_current + 2)) &&
       ((bVar1 = match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::bos((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x15dbd8), !bVar1 ||
        (uVar5 = false, ((ulong)local_18[5]._M_current & 0x100) != 0)))) {
      x._M_current._7_1_ = uVar5;
      x._M_current._0_7_ = in_stack_ffffffffffffffb8;
      local_30 = prior<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(x);
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_30);
      uVar5 = *pcVar4 == *(char *)((long)&(in_RDI->cur_)._M_current + 3);
    }
    if ((bool)uVar5 != false) {
      return false;
    }
  }
  bVar2 = (**(code **)(*local_20 + 0x10))(local_20,local_18);
  return (bool)(bVar2 & 1);
}

Assistant:

bool match(match_state<BidiIter> &state, Next const &next) const
        {
            if(state.eos())
            {
                if(!state.flags_.match_eol_)
                {
                    return false;
                }
            }
            else
            {
                char_type ch = *state.cur_;

                // If the current character is not a newline, we're not at the end of a line
                if(!traits_cast<Traits>(state).isctype(ch, this->newline_))
                {
                    return false;
                }
                // There is no line-break between \r and \n
                else if(ch == this->nl_ && (!state.bos() || state.flags_.match_prev_avail_) && *boost::prior(state.cur_) == this->cr_)
                {
                    return false;
                }
            }

            return next.match(state);
        }